

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O3

void __thiscall
duckdb::TopNBoundaryValue::UpdateValue(TopNBoundaryValue *this,string_t boundary_val)

{
  char (*__src) [4];
  bool bVar1;
  DynamicFilterData *this_00;
  char *pcVar2;
  OrderModifiers in_R9W;
  undefined4 uVar3;
  undefined8 uVar4;
  string_t sort_key;
  unique_lock<std::mutex> l;
  Value new_dynamic_value;
  anon_union_16_2_67f50693_for_value local_c0;
  unique_lock<std::mutex> local_b0;
  anon_union_16_2_67f50693_for_value local_a0;
  undefined1 local_90 [48];
  Value local_60;
  
  local_c0._0_8_ = boundary_val.value._0_8_;
  local_b0._M_device = &this->lock;
  local_b0._M_owns = false;
  local_c0.pointer.ptr = boundary_val.value._8_8_;
  ::std::unique_lock<std::mutex>::lock(&local_b0);
  local_b0._M_owns = true;
  uVar4 = boundary_val.value._8_8_;
  uVar3 = boundary_val.value._0_4_;
  if (this->is_set == true) {
    __src = (char (*) [4])(this->boundary_value)._M_dataplus._M_p;
    local_a0.pointer.length = (uint32_t)(this->boundary_value)._M_string_length;
    if (local_a0.pointer.length < 0xd) {
      local_a0._12_4_ = 0;
      local_a0.pointer.prefix[0] = '\0';
      local_a0.pointer.prefix[1] = '\0';
      local_a0.pointer.prefix[2] = '\0';
      local_a0.pointer.prefix[3] = '\0';
      local_a0._8_4_ = 0;
      if (local_a0.pointer.length != 0) {
        switchD_00b03519::default
                  (local_a0.pointer.prefix,__src,(ulong)(local_a0.pointer.length & 0xf));
      }
    }
    else {
      local_a0.pointer.prefix = *__src;
      local_a0._8_4_ = SUB84(__src,0);
      local_a0._12_4_ = (undefined4)((ulong)__src >> 0x20);
    }
    bVar1 = string_t::StringComparisonOperators::GreaterThan
                      ((string_t *)&local_a0.pointer,(string_t *)&local_c0.pointer);
    if (!bVar1) goto LAB_00bdfbb8;
    uVar4 = local_c0.pointer.ptr;
    uVar3 = local_c0.pointer.length;
  }
  pcVar2 = local_c0.pointer.prefix;
  if (0xc < (uint)uVar3) {
    pcVar2 = (char *)uVar4;
  }
  local_a0._0_8_ = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar2,pcVar2 + (uint)uVar3)
  ;
  ::std::__cxx11::string::operator=((string *)&this->boundary_value,(string *)&local_a0.pointer);
  if ((undefined1 *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_);
  }
  this->is_set = true;
  if ((this->op->dynamic_filter).internal.
      super___shared_ptr<duckdb::DynamicFilterData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    sort_key.value.pointer.ptr = (char *)&this->boundary_vector;
    sort_key.value._0_8_ = local_c0.pointer.ptr;
    CreateSortKeyHelpers::DecodeSortKey
              ((CreateSortKeyHelpers *)local_c0._0_8_,sort_key,(Vector *)0x0,
               (ulong)*(uint *)&this->boundary_modifiers,in_R9W);
    Vector::GetValue((Value *)&local_a0.pointer,&this->boundary_vector,0);
    ::std::unique_lock<std::mutex>::unlock(&local_b0);
    this_00 = shared_ptr<duckdb::DynamicFilterData,_true>::operator->(&this->op->dynamic_filter);
    Value::Value(&local_60,(Value *)&local_a0.pointer);
    DynamicFilterData::SetValue(this_00,&local_60);
    Value::~Value(&local_60);
    Value::~Value((Value *)&local_a0.pointer);
  }
LAB_00bdfbb8:
  ::std::unique_lock<std::mutex>::~unique_lock(&local_b0);
  return;
}

Assistant:

void UpdateValue(string_t boundary_val) {
		unique_lock<mutex> l(lock);
		if (!is_set || boundary_val < string_t(boundary_value)) {
			boundary_value = boundary_val.GetString();
			is_set = true;
			if (op.dynamic_filter) {
				CreateSortKeyHelpers::DecodeSortKey(boundary_val, boundary_vector, 0, boundary_modifiers);
				auto new_dynamic_value = boundary_vector.GetValue(0);
				l.unlock();
				op.dynamic_filter->SetValue(std::move(new_dynamic_value));
			}
		}
	}